

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O3

void anon_unknown.dwarf_8d25b::findEdgePoints<float>
               (vector<float,_std::allocator<float>_> *positive,
               vector<float,_std::allocator<float>_> *negative,
               vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *first,
               vector<int,_std::allocator<int>_> *second,EdgeParameter *edgeParameter,
               bool forwardDirection)

{
  int iVar1;
  edgeType eVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  
  piVar7 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar6 = (second->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (first->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar8 = (first->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar9 = piVar4;
  while (piVar7 = piVar7 + 1, piVar7 != piVar3) {
    *piVar9 = *piVar7 - piVar7[-1];
    piVar9 = piVar9 + 1;
  }
  while (piVar4 = piVar4 + 1, piVar4 != piVar8) {
    piVar6 = piVar6 + 1;
    *piVar6 = *piVar4 - piVar4[-1];
  }
  getEdgePoints<float>(positive,data,first,second,edgeParameter);
  removeSimilarPoints<float>(positive);
  piVar3 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar6 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar7 = piVar3 + -1;
  piVar4 = piVar6;
  if (piVar6 < piVar7 && piVar6 != piVar3) {
    do {
      piVar8 = piVar4 + 1;
      iVar1 = *piVar4;
      *piVar4 = *piVar7;
      *piVar7 = iVar1;
      piVar7 = piVar7 + -1;
      piVar4 = piVar8;
    } while (piVar8 < piVar7);
  }
  piVar7 = (first->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (first->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar8 = (second->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar9 = piVar7;
  while (piVar6 = piVar6 + 1, piVar6 != piVar3) {
    *piVar9 = *piVar6 - piVar6[-1];
    piVar9 = piVar9 + 1;
  }
  while (piVar7 = piVar7 + 1, piVar7 != piVar4) {
    piVar8 = piVar8 + 1;
    *piVar8 = *piVar7 - piVar7[-1];
  }
  getEdgePoints<float>(negative,data,first,second,edgeParameter);
  removeSimilarPoints<float>(negative);
  eVar2 = edgeParameter->edge;
  if ((!forwardDirection || eVar2 != FIRST) && ((eVar2 == LAST & ~forwardDirection) != 1)) {
    bVar5 = eVar2 == FIRST;
    if (forwardDirection) {
      bVar5 = eVar2 == LAST;
    }
    if ((bVar5) &&
       (leaveLastElement<float>(positive),
       4 < (ulong)((long)(negative->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(negative->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start))) {
      std::vector<float,_std::allocator<float>_>::resize(negative,1);
      return;
    }
    return;
  }
  if (4 < (ulong)((long)(positive->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(positive->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start)) {
    std::vector<float,_std::allocator<float>_>::resize(positive,1);
  }
  leaveLastElement<float>(negative);
  return;
}

Assistant:

void findEdgePoints( std::vector < _Type > & positive, std::vector < _Type > & negative, std::vector < int > & data,
                         std::vector < int > & first, std::vector < int > & second, const EdgeParameter & edgeParameter, bool forwardDirection )
    {
        getDerivatives( data, first, second );
        getEdgePoints( positive, data, first, second, edgeParameter );
        removeSimilarPoints( positive );

        std::reverse( data.begin(), data.end() );
        getDerivatives( data, first, second );
        getEdgePoints( negative, data, first, second, edgeParameter );
        removeSimilarPoints( negative );
        if ( (forwardDirection && edgeParameter.edge == EdgeParameter::FIRST) || (!forwardDirection && edgeParameter.edge == EdgeParameter::LAST) ) {
            leaveFirstElement( positive );
            leaveLastElement( negative );
        }
        else if ( (forwardDirection && edgeParameter.edge == EdgeParameter::LAST) || (!forwardDirection && edgeParameter.edge == EdgeParameter::FIRST) ) {
            leaveLastElement( positive );
            leaveFirstElement( negative );
        }
    }